

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm2js.cpp
# Opt level: O2

void anon_unknown.dwarf_aea87::replaceInPlace(Ref target,Ref value)

{
  size_t sVar1;
  undefined8 *puVar2;
  undefined8 *puVar3;
  size_t i;
  ulong uVar4;
  Value *local_38;
  Ref target_local;
  Ref value_local;
  
  local_38 = target.inst;
  target_local = value;
  if (((target.inst)->type == Array) && ((value.inst)->type == Array)) {
    sVar1 = cashew::Value::size(value.inst);
    cashew::Value::setSize(target.inst,sVar1);
    uVar4 = 0;
    while( true ) {
      sVar1 = cashew::Value::size(value.inst);
      if (sVar1 <= uVar4) break;
      puVar2 = (undefined8 *)cashew::Ref::operator[]((uint)&target_local);
      puVar3 = (undefined8 *)cashew::Ref::operator[]((uint)&local_38);
      *puVar3 = *puVar2;
      uVar4 = uVar4 + 1;
      value = target_local;
    }
    return;
  }
  __assert_fail("target->isArray() && value->isArray()",
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/wasm2js.cpp"
                ,0x86,"void (anonymous namespace)::replaceInPlace(Ref, Ref)");
}

Assistant:

static void replaceInPlace(Ref target, Ref value) {
  assert(target->isArray() && value->isArray());
  target->setSize(value->size());
  for (size_t i = 0; i < value->size(); i++) {
    target[i] = value[i];
  }
}